

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O3

workspace * workspace_create(char *name,size_t index)

{
  workspace *__ptr;
  list *plVar1;
  
  __ptr = (workspace *)malloc(0x28);
  if (__ptr != (workspace *)0x0) {
    __ptr->name = name;
    __ptr->index = index;
    __ptr->is_visible = false;
    __ptr->is_focused = false;
    plVar1 = list_create();
    __ptr->clients = plVar1;
    __ptr->active_client = (client *)0x0;
    if (plVar1 != (list *)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (workspace *)0x0;
}

Assistant:

struct workspace *workspace_create(const char *name, size_t index)
{
        struct workspace *workspace = malloc(sizeof(struct workspace));

        if (workspace == NULL) {
                return NULL;
        }

        workspace->name = name;
        workspace->index = index;
        workspace->is_visible = false;
        workspace->is_focused = false;
        workspace->clients = list_create();
        workspace->active_client = NULL;

        if (workspace->clients == NULL) {
                free(workspace);

                return NULL;
        }

        return workspace;
}